

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

int parse_entry(char *buff,entry *entry_i)

{
  ucs4_t *puVar1;
  ucs4_t *puVar2;
  ucs4_t **ppuVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  
  sVar8 = 4;
  sVar5 = 0;
  while( true ) {
    if (buff[sVar5] == '\0') {
      return -1;
    }
    if (buff[sVar5] == '\t') break;
    sVar5 = sVar5 + 1;
    sVar8 = sVar8 + 4;
  }
  puVar1 = utf8_to_ucs4(buff,sVar5);
  if (puVar1 != (ucs4_t *)0xffffffffffffffff) {
    pcVar7 = buff + sVar5;
    puVar2 = (ucs4_t *)malloc(sVar8);
    entry_i->key = puVar2;
    ucs4cpy(puVar2,puVar1);
    free(puVar1);
    ppuVar3 = (ucs4_t **)malloc(0x2000);
    entry_i->value = ppuVar3;
    lVar4 = -1;
    uVar6 = 0;
    uVar9 = 0x400;
    while( true ) {
      if ((*pcVar7 == '\0') || (*pcVar7 == '\n')) {
        ppuVar3 = (ucs4_t **)realloc(entry_i->value,uVar9 << 3);
        entry_i->value = ppuVar3;
        ppuVar3[uVar6] = (ucs4_t *)0x0;
        return 0;
      }
      uVar10 = uVar9;
      if (uVar9 <= uVar6) {
        uVar10 = uVar9 * 2;
        ppuVar3 = (ucs4_t **)realloc(entry_i->value,uVar9 << 4);
        entry_i->value = ppuVar3;
      }
      pcVar7 = pcVar7 + 1;
      sVar8 = 4;
      sVar5 = 0;
      while ((0x20 < (ulong)(byte)pcVar7[sVar5] ||
             ((0x100000401U >> ((ulong)(byte)pcVar7[sVar5] & 0x3f) & 1) == 0))) {
        sVar5 = sVar5 + 1;
        sVar8 = sVar8 + 4;
      }
      puVar1 = utf8_to_ucs4(pcVar7,sVar5);
      if (puVar1 == (ucs4_t *)0xffffffffffffffff) break;
      pcVar7 = pcVar7 + sVar5;
      puVar2 = (ucs4_t *)malloc(sVar8);
      entry_i->value[uVar6] = puVar2;
      ucs4cpy(entry_i->value[uVar6],puVar1);
      free(puVar1);
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 1;
      uVar9 = uVar10;
    }
    for (; -1 < lVar4; lVar4 = lVar4 + -1) {
      free(entry_i->value[lVar4]);
    }
    free(entry_i->value);
    free(entry_i->key);
    return -1;
  }
  return -1;
}

Assistant:

int parse_entry(const char * buff, entry * entry_i)
{
	size_t length;
	const char * pbuff;

	/* 解析鍵 */
	for (pbuff = buff; *pbuff != '\t' && *pbuff != '\0'; ++ pbuff)
		;
	if (*pbuff == '\0')
		return -1;
	length = pbuff - buff;

	ucs4_t * ucs4_buff;
	ucs4_buff = utf8_to_ucs4(buff, length);
	if (ucs4_buff == (ucs4_t *) -1)
		return -1;
	entry_i->key = (ucs4_t *) malloc((length + 1) * sizeof(ucs4_t));
	ucs4cpy(entry_i->key, ucs4_buff);
	free(ucs4_buff);

	/* 解析值 */
	size_t value_i, value_count = INITIAL_DICTIONARY_SIZE;
	entry_i->value = (ucs4_t **) malloc(value_count * sizeof (ucs4_t *));

	for (value_i = 0; *pbuff != '\0' && *pbuff != '\n'; ++ value_i)
	{
		if (value_i >= value_count)
		{
			value_count += value_count;
			entry_i->value = (ucs4_t **) realloc(
					entry_i->value,
					value_count * sizeof (ucs4_t *)
			);
		}

		for (buff = ++ pbuff; *pbuff != ' ' && *pbuff != '\0' && *pbuff != '\n'; ++ pbuff)
			;
		length = pbuff - buff;
		ucs4_buff = utf8_to_ucs4(buff, length);
		if (ucs4_buff == (ucs4_t *) -1)
		{
			/* 發生錯誤 回退內存申請 */
			ssize_t i;
			for (i = value_i - 1; i >= 0; -- i)
				free(entry_i->value[i]);
			free(entry_i->value);
			free(entry_i->key);
			return -1;
		}

		entry_i->value[value_i] = (ucs4_t *) malloc((length + 1) * sizeof(ucs4_t));
		ucs4cpy(entry_i->value[value_i], ucs4_buff);
		free(ucs4_buff);
	}

	entry_i->value = (ucs4_t **) realloc(
			entry_i->value,
			value_count * sizeof (ucs4_t *)
	);
	entry_i->value[value_i] = NULL;

	return 0;
}